

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtt.c
# Opt level: O3

void vtt_dump(vtt_t *head)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  vtt_block_t *pvVar8;
  double dVar9;
  
  puts("WEBVTT\r\n\r");
  for (pvVar8 = head->region_head; pvVar8 != (vtt_block_t *)0x0; pvVar8 = pvVar8->next) {
    printf("REGION\r\n%s\r\n",pvVar8 + 1);
  }
  for (pvVar8 = head->style_head; pvVar8 != (vtt_block_t *)0x0; pvVar8 = pvVar8->next) {
    printf("STYLE\r\n%s\r\n",pvVar8 + 1);
  }
  for (pvVar8 = head->cue_head; pvVar8 != (vtt_block_t *)0x0; pvVar8 = pvVar8->next) {
    dVar1 = pvVar8->timestamp;
    auVar2 = SEXT816((long)(dVar1 * 1000.0)) * SEXT816(0x20c49ba5e353f7cf);
    auVar6 = SEXT816((long)dVar1) * ZEXT816(0x8888888888888889);
    auVar7 = SEXT816((long)(dVar1 / 60.0)) * ZEXT816(0x8888888888888889);
    dVar9 = pvVar8->duration + dVar1;
    auVar3 = SEXT816((long)(dVar9 * 1000.0)) * SEXT816(0x20c49ba5e353f7cf);
    auVar4 = SEXT816((long)dVar9) * ZEXT816(0x8888888888888889);
    auVar5 = SEXT816((long)(dVar9 / 60.0)) * ZEXT816(0x8888888888888889);
    if (pvVar8->cue_id != (char *)0x0) {
      puts(pvVar8->cue_id);
    }
    printf("%02d:%02d:%02d.%03d --> %02d:%02d:%02d.%03d",(long)(dVar1 / 3600.0),
           (ulong)(uint)((int)(long)(dVar1 / 60.0) +
                        ((int)(auVar7._8_8_ >> 5) - (auVar7._12_4_ >> 0x1f)) * -0x3c),
           (ulong)(uint)((int)(long)dVar1 +
                        ((int)(auVar6._8_8_ >> 5) - (auVar6._12_4_ >> 0x1f)) * -0x3c),
           (ulong)(uint)((int)(long)(dVar1 * 1000.0) +
                        ((int)(auVar2._8_8_ >> 7) - (auVar2._12_4_ >> 0x1f)) * -1000),
           (long)(dVar9 / 3600.0),
           (ulong)(uint)((int)(long)(dVar9 / 60.0) +
                        ((int)(auVar5._8_8_ >> 5) - (auVar5._12_4_ >> 0x1f)) * -0x3c),
           (ulong)(uint)((int)(long)dVar9 +
                        ((int)(auVar4._8_8_ >> 5) - (auVar4._12_4_ >> 0x1f)) * -0x3c),
           (ulong)(uint)((int)(long)(dVar9 * 1000.0) +
                        ((int)(auVar3._8_8_ >> 7) - (auVar3._12_4_ >> 0x1f)) * -1000));
    if (pvVar8->cue_settings != (char *)0x0) {
      printf(" %s");
    }
    printf("\r\n%s\r\n",pvVar8 + 1);
  }
  return;
}

Assistant:

void vtt_dump(vtt_t* head) { _dump(head); }